

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O3

void __thiscall LexerTest_LexInt_Test::~LexerTest_LexInt_Test(LexerTest_LexInt_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LexerTest, LexInt) {
  EXPECT_EQ(Lexer("0"sv).takeU8(), uint8_t(0));
  EXPECT_EQ(Lexer("0"sv).takeI8(), uint8_t(0));
  EXPECT_EQ(Lexer("0"sv).takeI16(), uint16_t(0));
  EXPECT_EQ(Lexer("0"sv).takeU32(), uint32_t(0));
  EXPECT_EQ(Lexer("0"sv).takeI32(), uint32_t(0));
  EXPECT_EQ(Lexer("0"sv).takeU64(), uint64_t(0));
  EXPECT_EQ(Lexer("0"sv).takeI64(), uint64_t(0));

  EXPECT_FALSE(Lexer("+0"sv).takeU8());
  EXPECT_EQ(Lexer("+0"sv).takeI8(), uint8_t(0));

  EXPECT_FALSE(Lexer("-0"sv).takeU8());
  EXPECT_EQ(Lexer("-0"sv).takeI8(), uint8_t(0));

  EXPECT_EQ(Lexer("1"sv).takeU8(), uint8_t(1));
  EXPECT_EQ(Lexer("1"sv).takeI8(), uint8_t(1));

  EXPECT_FALSE(Lexer("+1"sv).takeU8());
  EXPECT_EQ(Lexer("+1"sv).takeI8(), uint8_t(1));

  EXPECT_FALSE(Lexer("-1"sv).takeU8());
  EXPECT_EQ(Lexer("-1").takeI8(), uint8_t(-1));

  EXPECT_EQ(Lexer("0010"sv).takeU8(), uint8_t(10));
  EXPECT_EQ(Lexer("0010"sv).takeI8(), uint8_t(10));

  EXPECT_FALSE(Lexer("+0010"sv).takeU8());
  EXPECT_EQ(Lexer("+0010"sv).takeI8(), uint8_t(10));

  EXPECT_FALSE(Lexer("-0010"sv).takeU8());
  EXPECT_EQ(Lexer("-0010"sv).takeI8(), uint8_t(-10));

  EXPECT_FALSE(Lexer("9999"sv).takeU8());
  EXPECT_EQ(Lexer("9999"sv).takeI16(), uint16_t(9999));
  EXPECT_EQ(Lexer("9999"sv).takeU32(), uint32_t(9999));
  EXPECT_EQ(Lexer("9999"sv).takeI32(), uint32_t(9999));

  EXPECT_FALSE(Lexer("+9999"sv).takeU32());
  EXPECT_EQ(Lexer("+9999"sv).takeI32(), uint32_t(9999));

  EXPECT_FALSE(Lexer("-9999"sv).takeU32());
  EXPECT_EQ(Lexer("-9999"sv).takeI32(), uint32_t(-9999));

  EXPECT_EQ(Lexer("12_34"sv).takeU32(), uint32_t(1234));
  EXPECT_EQ(Lexer("12_34"sv).takeI32(), uint32_t(1234));

  EXPECT_EQ(Lexer("1_2_3_4"sv).takeU32(), uint32_t(1234));
  EXPECT_EQ(Lexer("1_2_3_4"sv).takeI32(), uint32_t(1234));

  EXPECT_FALSE(Lexer("_1234"sv).takeU32());
  EXPECT_FALSE(Lexer("_1234"sv).takeI32());

  EXPECT_FALSE(Lexer("1234_"sv).takeU32());
  EXPECT_FALSE(Lexer("1234_"sv).takeI32());

  EXPECT_FALSE(Lexer("12__34"sv).takeU32());
  EXPECT_FALSE(Lexer("12__34"sv).takeI32());

  EXPECT_FALSE(Lexer("12cd56"sv).takeU32());
  EXPECT_FALSE(Lexer("12cd56"sv).takeI32());

  EXPECT_EQ(Lexer("18446744073709551615"sv).takeU64(), uint64_t(-1));
  EXPECT_EQ(Lexer("18446744073709551615"sv).takeI64(), uint64_t(-1));

  // 64-bit overflow!
  EXPECT_FALSE(Lexer("18446744073709551616"sv).takeU64());
  EXPECT_FALSE(Lexer("18446744073709551616"sv).takeI64());

  EXPECT_FALSE(Lexer("+9223372036854775807"sv).takeU64());
  EXPECT_EQ(Lexer("+9223372036854775807"sv).takeI64(), INT64_MAX);

  EXPECT_EQ(Lexer("9223372036854775808"sv).takeU64(), uint64_t(INT64_MAX) + 1);
  EXPECT_EQ(Lexer("9223372036854775808"sv).takeI64(), uint64_t(INT64_MAX) + 1);

  EXPECT_FALSE(Lexer("+9223372036854775808"sv).takeU64());
  EXPECT_FALSE(Lexer("+9223372036854775808"sv).takeI64());

  EXPECT_FALSE(Lexer("-9223372036854775808"sv).takeU64());
  EXPECT_EQ(Lexer("-9223372036854775808"sv).takeI64(), uint64_t(INT64_MIN));

  EXPECT_FALSE(Lexer("-9223372036854775809"sv).takeU64());
  EXPECT_FALSE(Lexer("-9223372036854775809"sv).takeI64());
}